

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_result ma_stbvorbis_ds_get_length(ma_data_source *pDataSource,ma_uint64 *pLength)

{
  uint uVar1;
  ulong uVar2;
  ma_result mVar3;
  
  mVar3 = MA_INVALID_ARGS;
  if ((pLength != (ma_uint64 *)0x0) && (*pLength = 0, pDataSource != (ma_data_source *)0x0)) {
    mVar3 = MA_SUCCESS;
    if (*(int *)((long)pDataSource + 0xa8) == 0) {
      uVar1 = stb_vorbis_stream_length_in_samples(*(stb_vorbis **)((long)pDataSource + 0xa0));
      uVar2 = (ulong)uVar1;
    }
    else {
      uVar2 = 0;
    }
    *pLength = uVar2;
  }
  return mVar3;
}

Assistant:

static ma_result ma_stbvorbis_ds_get_length(ma_data_source* pDataSource, ma_uint64* pLength)
{
    return ma_stbvorbis_get_length_in_pcm_frames((ma_stbvorbis*)pDataSource, pLength);
}